

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall
testing::internal::NoExecDeathTest::NoExecDeathTest
          (NoExecDeathTest *this,char *a_statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher)

{
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_28;
  
  local_28.vtable_ =
       (matcher->
       super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
       ).vtable_;
  local_28.buffer_ =
       (matcher->
       super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
       ).buffer_;
  (matcher->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).vtable_ = (VTable *)0x0;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002a6278;
  ForkingDeathTest::ForkingDeathTest
            (&this->super_ForkingDeathTest,a_statement,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_28);
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_28);
  (this->super_ForkingDeathTest).super_DeathTestImpl.super_DeathTest._vptr_DeathTest =
       (_func_int **)&PTR__DeathTestImpl_002a5f30;
  return;
}

Assistant:

NoExecDeathTest(const char* a_statement, Matcher<const std::string&> matcher)
      : ForkingDeathTest(a_statement, std::move(matcher)) {}